

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O3

void jpeg_idct_13x13(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  JSAMPLE *pJVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  int aiStack_1d8 [106];
  
  pJVar5 = cinfo->sample_range_limit;
  pvVar6 = compptr->dct_table;
  lVar24 = 0;
  do {
    lVar9 = (long)*(short *)((long)pvVar6 + lVar24 * 2) * (long)coef_block[lVar24] * 0x2000;
    lVar11 = (long)*(short *)((long)pvVar6 + lVar24 * 2 + 0x20) * (long)coef_block[lVar24 + 0x10];
    lVar13 = (long)*(short *)((long)pvVar6 + lVar24 * 2 + 0x40) * (long)coef_block[lVar24 + 0x20];
    lVar26 = (long)*(short *)((long)pvVar6 + lVar24 * 2 + 0x60) * (long)coef_block[lVar24 + 0x30];
    lVar12 = lVar26 + lVar13;
    lVar13 = lVar13 - lVar26;
    lVar29 = lVar13 * 0x319 + lVar9 + 0x400;
    lVar44 = lVar11 * 0x2bf1 + lVar12 * 0x24f9 + lVar29;
    lVar29 = lVar11 * 0x100c + lVar12 * -0x24f9 + lVar29;
    lVar31 = lVar13 * 0xf95 + lVar9 + 0x400;
    lVar36 = lVar11 * 0x21e0 + lVar12 * -0xa20 + lVar31;
    lVar31 = lVar11 * -0x2812 + lVar12 * 0xa20 + lVar31;
    lVar27 = lVar13 * -0x1dfe + lVar9 + 0x400;
    lVar39 = lVar11 * -0x574 + lVar12 * -0xdf2 + lVar27;
    lVar27 = lVar11 * -0x19b5 + lVar12 * 0xdf2 + lVar27;
    lVar37 = (long)*(short *)((long)pvVar6 + lVar24 * 2 + 0x10) * (long)coef_block[lVar24 + 8];
    lVar20 = (long)*(short *)((long)pvVar6 + lVar24 * 2 + 0x30) * (long)coef_block[lVar24 + 0x18];
    lVar28 = (long)*(short *)((long)pvVar6 + lVar24 * 2 + 0x50) * (long)coef_block[lVar24 + 0x28];
    lVar32 = (long)*(short *)((long)pvVar6 + lVar24 * 2 + 0x70) * (long)coef_block[lVar24 + 0x38];
    lVar26 = (lVar20 + lVar37) * 0x2a50;
    lVar12 = (lVar28 + lVar37) * 0x253e;
    lVar33 = (lVar32 + lVar37) * 0x1e02;
    lVar22 = lVar37 * -0x40a5 + lVar26 + lVar12 + lVar33;
    lVar14 = (lVar28 + lVar20) * -0xad5;
    lVar16 = (lVar32 + lVar20) * -0x253e;
    lVar26 = lVar14 + lVar16 + lVar20 * 0x1acb + lVar26;
    lVar17 = (lVar32 + lVar28) * -0x1508;
    lVar12 = lVar12 + lVar17 + lVar28 * -0x324f + lVar14;
    lVar16 = lVar33 + lVar17 + lVar32 * 0x4694 + lVar16;
    lVar14 = (lVar28 - lVar20) * 0x1e02 + (lVar32 + lVar37) * 0xad5;
    lVar17 = lVar20 * -0xeea + lVar37 * 0xa33 + lVar14;
    lVar14 = lVar32 * -0x37c1 + lVar28 * 0xc4e + lVar14;
    aiStack_1d8[lVar24] = (int)((ulong)(lVar22 + lVar44) >> 0xb);
    aiStack_1d8[lVar24 + 0x60] = (int)((ulong)(lVar44 - lVar22) >> 0xb);
    aiStack_1d8[lVar24 + 8] = (int)((ulong)(lVar26 + lVar36) >> 0xb);
    aiStack_1d8[lVar24 + 0x58] = (int)((ulong)(lVar36 - lVar26) >> 0xb);
    aiStack_1d8[lVar24 + 0x10] = (int)((ulong)(lVar12 + lVar29) >> 0xb);
    aiStack_1d8[lVar24 + 0x50] = (int)((ulong)(lVar29 - lVar12) >> 0xb);
    aiStack_1d8[lVar24 + 0x18] = (int)((ulong)(lVar16 + lVar39) >> 0xb);
    aiStack_1d8[lVar24 + 0x48] = (int)((ulong)(lVar39 - lVar16) >> 0xb);
    aiStack_1d8[lVar24 + 0x20] = (int)((ulong)(lVar27 + lVar17) >> 0xb);
    aiStack_1d8[lVar24 + 0x40] = (int)((ulong)(lVar27 - lVar17) >> 0xb);
    aiStack_1d8[lVar24 + 0x28] = (int)((ulong)(lVar31 + lVar14) >> 0xb);
    aiStack_1d8[lVar24 + 0x38] = (int)((ulong)(lVar31 - lVar14) >> 0xb);
    aiStack_1d8[lVar24 + 0x30] = (int)(lVar9 + (lVar13 - lVar11) * 0x2d41 + 0x400U >> 0xb);
    lVar24 = lVar24 + 1;
  } while ((int)lVar24 != 8);
  uVar10 = (ulong)output_col;
  lVar24 = 0;
  do {
    iVar21 = aiStack_1d8[lVar24 + 1];
    iVar1 = aiStack_1d8[lVar24 + 2];
    iVar7 = aiStack_1d8[lVar24] * 0x2000;
    iVar8 = aiStack_1d8[lVar24 + 6] + aiStack_1d8[lVar24 + 4];
    iVar23 = aiStack_1d8[lVar24 + 4] - aiStack_1d8[lVar24 + 6];
    iVar18 = iVar23 * 0x319 + iVar7 + 0x20000;
    iVar40 = iVar23 * 0xf95 + iVar7 + 0x20000;
    iVar30 = iVar1 * 0x2bf1 + iVar8 * 0x24f9 + iVar18;
    iVar18 = iVar1 * 0x100c + iVar8 * -0x24f9 + iVar18;
    iVar34 = iVar23 * -0x1dfe + iVar7 + 0x20000;
    iVar15 = iVar1 * 0x21e0 + iVar8 * -0xa20 + iVar40;
    iVar40 = iVar1 * -0x2812 + iVar8 * 0xa20 + iVar40;
    iVar38 = iVar1 * -0x574 + iVar8 * -0xdf2 + iVar34;
    iVar2 = aiStack_1d8[lVar24 + 3];
    iVar3 = aiStack_1d8[lVar24 + 5];
    iVar4 = aiStack_1d8[lVar24 + 7];
    iVar34 = iVar1 * -0x19b5 + iVar8 * 0xdf2 + iVar34;
    iVar41 = (iVar21 + iVar2) * 0x2a50;
    iVar19 = (iVar3 + iVar21) * 0x253e;
    iVar35 = (iVar4 + iVar21) * 0x1e02;
    iVar8 = iVar21 * -0x40a5 + iVar41 + iVar19 + iVar35;
    iVar42 = (iVar3 + iVar2) * -0xad5;
    iVar25 = (iVar4 + iVar2) * -0x253e;
    iVar43 = iVar42 + iVar25 + iVar2 * 0x1acb + iVar41;
    iVar41 = (iVar4 + iVar3) * -0x1508;
    iVar19 = iVar19 + iVar41 + iVar3 * -0x324f + iVar42;
    iVar41 = iVar35 + iVar41 + iVar4 * 0x4694 + iVar25;
    iVar25 = (iVar3 - iVar2) * 0x1e02 + (iVar4 + iVar21) * 0xad5;
    iVar21 = iVar2 * -0xeea + iVar21 * 0xa33 + iVar25;
    iVar25 = iVar4 * -0x37c1 + iVar3 * 0xc4e + iVar25;
    lVar12 = *(long *)((long)output_buf + lVar24);
    *(JSAMPLE *)(lVar12 + uVar10) = pJVar5[(ulong)((uint)(iVar8 + iVar30) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 0xc + uVar10) =
         pJVar5[(ulong)((uint)(iVar30 - iVar8) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 1 + uVar10) =
         pJVar5[(ulong)((uint)(iVar43 + iVar15) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 0xb + uVar10) =
         pJVar5[(ulong)((uint)(iVar15 - iVar43) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 2 + uVar10) =
         pJVar5[(ulong)((uint)(iVar18 + iVar19) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 10 + uVar10) =
         pJVar5[(ulong)((uint)(iVar18 - iVar19) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 3 + uVar10) =
         pJVar5[(ulong)((uint)(iVar41 + iVar38) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 9 + uVar10) =
         pJVar5[(ulong)((uint)(iVar38 - iVar41) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 4 + uVar10) =
         pJVar5[(ulong)((uint)(iVar21 + iVar34) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 8 + uVar10) =
         pJVar5[(ulong)((uint)(iVar34 - iVar21) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 5 + uVar10) =
         pJVar5[(ulong)((uint)(iVar40 + iVar25) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 7 + uVar10) =
         pJVar5[(ulong)((uint)(iVar40 - iVar25) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar12 + 6 + uVar10) =
         pJVar5[(ulong)(iVar7 + (iVar23 - iVar1) * 0x2d41 + 0x20000U >> 0x12 & 0x3ff) + 0x80];
    lVar24 = lVar24 + 8;
  } while (lVar24 != 0x68);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_13x13(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25, tmp26;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 13];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp10 = z3 + z4;
    tmp11 = z3 - z4;

    tmp12 = MULTIPLY(tmp10, FIX(1.155388986));                /* (c4+c6)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.096834934)) + z1;           /* (c4-c6)/2 */

    tmp20 = MULTIPLY(z2, FIX(1.373119086)) + tmp12 + tmp13;   /* c2 */
    tmp22 = MULTIPLY(z2, FIX(0.501487041)) - tmp12 + tmp13;   /* c10 */

    tmp12 = MULTIPLY(tmp10, FIX(0.316450131));                /* (c8-c12)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.486914739)) + z1;           /* (c8+c12)/2 */

    tmp21 = MULTIPLY(z2, FIX(1.058554052)) - tmp12 + tmp13;   /* c6 */
    tmp25 = MULTIPLY(z2, -FIX(1.252223920)) + tmp12 + tmp13;  /* c4 */

    tmp12 = MULTIPLY(tmp10, FIX(0.435816023));                /* (c2-c10)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.937303064)) - z1;           /* (c2+c10)/2 */

    tmp23 = MULTIPLY(z2, -FIX(0.170464608)) - tmp12 - tmp13;  /* c12 */
    tmp24 = MULTIPLY(z2, -FIX(0.803364869)) + tmp12 - tmp13;  /* c8 */

    tmp26 = MULTIPLY(tmp11 - z2, FIX(1.414213562)) + z1;      /* c0 */

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = MULTIPLY(z1 + z2, FIX(1.322312651));     /* c3 */
    tmp12 = MULTIPLY(z1 + z3, FIX(1.163874945));     /* c5 */
    tmp15 = z1 + z4;
    tmp13 = MULTIPLY(tmp15, FIX(0.937797057));       /* c7 */
    tmp10 = tmp11 + tmp12 + tmp13 -
            MULTIPLY(z1, FIX(2.020082300));          /* c7+c5+c3-c1 */
    tmp14 = MULTIPLY(z2 + z3, -FIX(0.338443458));    /* -c11 */
    tmp11 += tmp14 + MULTIPLY(z2, FIX(0.837223564)); /* c5+c9+c11-c3 */
    tmp12 += tmp14 - MULTIPLY(z3, FIX(1.572116027)); /* c1+c5-c9-c11 */
    tmp14 = MULTIPLY(z2 + z4, -FIX(1.163874945));    /* -c5 */
    tmp11 += tmp14;
    tmp13 += tmp14 + MULTIPLY(z4, FIX(2.205608352)); /* c3+c5+c9-c7 */
    tmp14 = MULTIPLY(z3 + z4, -FIX(0.657217813));    /* -c9 */
    tmp12 += tmp14;
    tmp13 += tmp14;
    tmp15 = MULTIPLY(tmp15, FIX(0.338443458));       /* c11 */
    tmp14 = tmp15 + MULTIPLY(z1, FIX(0.318774355)) - /* c9-c11 */
            MULTIPLY(z2, FIX(0.466105296));          /* c1-c7 */
    z1    = MULTIPLY(z3 - z2, FIX(0.937797057));     /* c7 */
    tmp14 += z1;
    tmp15 += z1 + MULTIPLY(z3, FIX(0.384515595)) -   /* c3-c7 */
             MULTIPLY(z4, FIX(1.742345811));         /* c1+c11 */

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 12] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp25 - tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp26, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 13 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 13; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z1 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z1 = LEFT_SHIFT(z1, CONST_BITS);

    z2 = (JLONG)wsptr[2];
    z3 = (JLONG)wsptr[4];
    z4 = (JLONG)wsptr[6];

    tmp10 = z3 + z4;
    tmp11 = z3 - z4;

    tmp12 = MULTIPLY(tmp10, FIX(1.155388986));                /* (c4+c6)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.096834934)) + z1;           /* (c4-c6)/2 */

    tmp20 = MULTIPLY(z2, FIX(1.373119086)) + tmp12 + tmp13;   /* c2 */
    tmp22 = MULTIPLY(z2, FIX(0.501487041)) - tmp12 + tmp13;   /* c10 */

    tmp12 = MULTIPLY(tmp10, FIX(0.316450131));                /* (c8-c12)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.486914739)) + z1;           /* (c8+c12)/2 */

    tmp21 = MULTIPLY(z2, FIX(1.058554052)) - tmp12 + tmp13;   /* c6 */
    tmp25 = MULTIPLY(z2, -FIX(1.252223920)) + tmp12 + tmp13;  /* c4 */

    tmp12 = MULTIPLY(tmp10, FIX(0.435816023));                /* (c2-c10)/2 */
    tmp13 = MULTIPLY(tmp11, FIX(0.937303064)) - z1;           /* (c2+c10)/2 */

    tmp23 = MULTIPLY(z2, -FIX(0.170464608)) - tmp12 - tmp13;  /* c12 */
    tmp24 = MULTIPLY(z2, -FIX(0.803364869)) + tmp12 - tmp13;  /* c8 */

    tmp26 = MULTIPLY(tmp11 - z2, FIX(1.414213562)) + z1;      /* c0 */

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    tmp11 = MULTIPLY(z1 + z2, FIX(1.322312651));     /* c3 */
    tmp12 = MULTIPLY(z1 + z3, FIX(1.163874945));     /* c5 */
    tmp15 = z1 + z4;
    tmp13 = MULTIPLY(tmp15, FIX(0.937797057));       /* c7 */
    tmp10 = tmp11 + tmp12 + tmp13 -
            MULTIPLY(z1, FIX(2.020082300));          /* c7+c5+c3-c1 */
    tmp14 = MULTIPLY(z2 + z3, -FIX(0.338443458));    /* -c11 */
    tmp11 += tmp14 + MULTIPLY(z2, FIX(0.837223564)); /* c5+c9+c11-c3 */
    tmp12 += tmp14 - MULTIPLY(z3, FIX(1.572116027)); /* c1+c5-c9-c11 */
    tmp14 = MULTIPLY(z2 + z4, -FIX(1.163874945));    /* -c5 */
    tmp11 += tmp14;
    tmp13 += tmp14 + MULTIPLY(z4, FIX(2.205608352)); /* c3+c5+c9-c7 */
    tmp14 = MULTIPLY(z3 + z4, -FIX(0.657217813));    /* -c9 */
    tmp12 += tmp14;
    tmp13 += tmp14;
    tmp15 = MULTIPLY(tmp15, FIX(0.338443458));       /* c11 */
    tmp14 = tmp15 + MULTIPLY(z1, FIX(0.318774355)) - /* c9-c11 */
            MULTIPLY(z2, FIX(0.466105296));          /* c1-c7 */
    z1    = MULTIPLY(z3 - z2, FIX(0.937797057));     /* c7 */
    tmp14 += z1;
    tmp15 += z1 + MULTIPLY(z3, FIX(0.384515595)) -   /* c3-c7 */
             MULTIPLY(z4, FIX(1.742345811));         /* c1+c11 */

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[12] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp26,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}